

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_scan.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_trace_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  parasail_result_t *ppVar4;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  int a;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  byte *pbVar18;
  ulong size;
  size_t size_00;
  int *__s;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int local_b0;
  int local_a4;
  ulong local_78;
  int *local_70;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_trace_scan_cold_7();
    return (parasail_result_t *)0x0;
  }
  local_78 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_trace_scan_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_trace_scan_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_trace_scan_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_trace_scan_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_trace_scan_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar13 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_trace_scan_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    uVar13 = (ulong)(uint)matrix->length;
  }
  a = (int)uVar13;
  ppVar4 = parasail_result_new_trace(a,s2Len,0x10,1);
  if (ppVar4 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  uVar7 = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
          (uint)(s2_end != 0) << 0xf | ppVar4->flag | 0x1480202;
  ppVar4->flag = uVar7;
  size = (ulong)(uint)s2Len;
  ptr = parasail_memalign_int(0x10,size);
  uVar3 = a + 1;
  ptr_00 = parasail_memalign_int(0x10,(long)(int)uVar3);
  size_00 = (size_t)a;
  ptr_01 = parasail_memalign_int(0x10,size_00);
  ptr_02 = parasail_memalign_int(0x10,(long)(int)uVar3);
  ptr_03 = parasail_memalign_int(0x10,size_00);
  auVar19._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
  auVar19._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
  auVar19._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
  auVar19._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
  iVar8 = movmskps(uVar7,auVar19);
  if (iVar8 != 0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_03 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  pbVar18 = (byte *)((ppVar4->field_4).rowcols)->score_row;
  if (matrix->type == 0) {
    local_70 = parasail_memalign_int(0x10,size_00);
    if (local_70 == (int *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < a) {
      piVar1 = matrix->mapper;
      uVar10 = 0;
      do {
        local_70[uVar10] = piVar1[(byte)_s1[uVar10]];
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
    }
  }
  else {
    local_70 = (int *)0x0;
  }
  __s = ptr_00 + 1;
  piVar1 = matrix->mapper;
  uVar10 = 0;
  do {
    ptr[uVar10] = piVar1[(byte)_s2[uVar10]];
    uVar10 = uVar10 + 1;
  } while (size != uVar10);
  *ptr_00 = 0;
  *ptr_02 = 0;
  auVar19 = _DAT_00903aa0;
  if (s1_beg == 0) {
    if (0 < a) {
      lVar14 = uVar13 - 1;
      auVar20._8_4_ = (int)lVar14;
      auVar20._0_8_ = lVar14;
      auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
      iVar8 = -open;
      lVar14 = 0;
      auVar20 = auVar20 ^ _DAT_00903aa0;
      auVar25 = _DAT_00903a90;
      do {
        auVar24 = auVar25 ^ auVar19;
        if ((bool)(~(auVar24._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar24._0_4_ ||
                    auVar20._4_4_ < auVar24._4_4_) & 1)) {
          *(int *)((long)ptr_00 + lVar14 + 4) = iVar8;
        }
        if ((auVar24._12_4_ != auVar20._12_4_ || auVar24._8_4_ <= auVar20._8_4_) &&
            auVar24._12_4_ <= auVar20._12_4_) {
          *(int *)((long)ptr_00 + lVar14 + 8) = iVar8 - gap;
        }
        lVar22 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 2;
        auVar25._8_8_ = lVar22 + 2;
        lVar14 = lVar14 + 8;
        iVar8 = iVar8 + gap * -2;
      } while ((ulong)(uVar3 >> 1) << 3 != lVar14);
      goto LAB_0056140b;
    }
  }
  else if (0 < a) {
    memset(__s,0,uVar13 * 4);
LAB_0056140b:
    auVar19 = _DAT_00903aa0;
    lVar14 = uVar13 - 1;
    auVar21._8_4_ = (int)lVar14;
    auVar21._0_8_ = lVar14;
    auVar21._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar10 = 0;
    auVar21 = auVar21 ^ _DAT_00903aa0;
    auVar24 = _DAT_00903a80;
    auVar23 = _DAT_00903a90;
    do {
      auVar25 = auVar23 ^ auVar19;
      iVar8 = auVar21._4_4_;
      if ((bool)(~(auVar25._4_4_ == iVar8 && auVar21._0_4_ < auVar25._0_4_ || iVar8 < auVar25._4_4_)
                & 1)) {
        ptr_01[uVar10] = -0x40000000;
      }
      if ((auVar25._12_4_ != auVar21._12_4_ || auVar25._8_4_ <= auVar21._8_4_) &&
          auVar25._12_4_ <= auVar21._12_4_) {
        ptr_01[uVar10 + 1] = -0x40000000;
      }
      auVar25 = auVar24 ^ auVar19;
      iVar9 = auVar25._4_4_;
      if (iVar9 <= iVar8 && (iVar9 != iVar8 || auVar25._0_4_ <= auVar21._0_4_)) {
        ptr_01[uVar10 + 2] = -0x40000000;
        ptr_01[uVar10 + 3] = -0x40000000;
      }
      uVar10 = uVar10 + 4;
      lVar14 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar14 + 4;
      lVar14 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar14 + 4;
    } while ((a + 3U & 0xfffffffc) != uVar10);
    bVar2 = true;
    goto LAB_0056150c;
  }
  bVar2 = false;
LAB_0056150c:
  uVar3 = s2Len - 1;
  local_a4 = a;
  if (s2Len == 1) {
    local_78 = 1;
    local_b0 = -0x40000000;
  }
  else {
    uVar10 = 1;
    if (1 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    local_b0 = -0x40000000;
    uVar5 = 0;
    pbVar12 = pbVar18;
    do {
      if (bVar2) {
        uVar17 = 0;
        pbVar11 = pbVar12;
        do {
          iVar9 = __s[uVar17] - open;
          iVar16 = ptr_01[uVar17] - gap;
          iVar8 = iVar16;
          if (iVar16 <= iVar9) {
            iVar8 = iVar9;
          }
          ptr_01[uVar17] = iVar8;
          *pbVar11 = (iVar9 <= iVar16) * '\b' + 8;
          uVar17 = uVar17 + 1;
          pbVar11 = pbVar11 + size;
        } while (uVar13 != uVar17);
        iVar8 = -((int)uVar5 * gap + open);
        if (s2_beg != 0) {
          iVar8 = 0;
        }
        *ptr_02 = iVar8;
        if (bVar2) {
          piVar1 = matrix->matrix;
          uVar17 = 0;
          do {
            if (matrix->type == 0) {
              iVar9 = local_70[uVar17];
            }
            else {
              iVar9 = (int)uVar17;
            }
            iVar16 = ptr_00[uVar17] + piVar1[(long)(matrix->size * iVar9) + (long)ptr[uVar5]];
            iVar9 = ptr_01[uVar17];
            if (ptr_01[uVar17] < iVar16) {
              iVar9 = iVar16;
            }
            ptr_02[uVar17 + 1] = iVar9;
            ptr_03[uVar17] = (uint)(iVar16 < ptr_01[uVar17]);
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
          if (bVar2) {
            iVar9 = -0x40000000;
            uVar17 = 0;
            pbVar11 = pbVar12;
            do {
              iVar16 = iVar9 - gap;
              iVar9 = ptr_02[uVar17];
              if (ptr_02[uVar17] <= iVar16) {
                iVar9 = iVar16;
              }
              iVar15 = iVar9 - open;
              *pbVar11 = *pbVar11 | (ptr_00[uVar17] <= iVar16) * ' ' + 0x20U;
              if (iVar15 < ptr_02[uVar17 + 1]) {
                __s[uVar17] = ptr_02[uVar17 + 1];
                *pbVar11 = *pbVar11 | (ptr_03[uVar17] == 0) * '\x03' + 1U;
              }
              else {
                __s[uVar17] = iVar15;
                if (ptr_02[uVar17 + 1] == iVar15) {
                  if (ptr_03[uVar17] == 0) {
                    bVar6 = *pbVar11 | 4;
                  }
                  else {
                    bVar6 = *pbVar11 | 2;
                  }
                  *pbVar11 = bVar6;
                }
                else {
                  *pbVar11 = *pbVar11 | 2;
                }
              }
              uVar17 = uVar17 + 1;
              pbVar11 = pbVar11 + size;
            } while (uVar13 != uVar17);
          }
        }
      }
      else {
        iVar8 = -((int)uVar5 * gap + open);
        if (s2_beg != 0) {
          iVar8 = 0;
        }
        *ptr_02 = iVar8;
      }
      *ptr_00 = iVar8;
      if ((s2_end != 0) && (local_b0 < __s[a + -1])) {
        local_78 = uVar5 & 0xffffffff;
        local_a4 = a + -1;
        local_b0 = __s[a + -1];
      }
      uVar5 = uVar5 + 1;
      pbVar12 = pbVar12 + 1;
    } while (uVar5 != uVar10);
  }
  if (bVar2) {
    pbVar12 = pbVar18 + uVar3;
    uVar10 = 0;
    do {
      iVar9 = __s[uVar10] - open;
      iVar16 = ptr_01[uVar10] - gap;
      iVar8 = iVar16;
      if (iVar16 <= iVar9) {
        iVar8 = iVar9;
      }
      ptr_01[uVar10] = iVar8;
      *pbVar12 = (iVar9 <= iVar16) * '\b' + 8;
      uVar10 = uVar10 + 1;
      pbVar12 = pbVar12 + size;
    } while (uVar13 != uVar10);
    iVar8 = 0;
    if (s2_beg == 0) {
      iVar8 = -(uVar3 * gap + open);
    }
    *ptr_02 = iVar8;
    if (bVar2) {
      piVar1 = matrix->matrix;
      uVar10 = 0;
      do {
        if (matrix->type == 0) {
          iVar8 = local_70[uVar10];
        }
        else {
          iVar8 = (int)uVar10;
        }
        iVar9 = ptr_00[uVar10] + piVar1[(long)(matrix->size * iVar8) + (long)ptr[uVar3]];
        iVar8 = ptr_01[uVar10];
        if (ptr_01[uVar10] < iVar9) {
          iVar8 = iVar9;
        }
        ptr_02[uVar10 + 1] = iVar8;
        ptr_03[uVar10] = (uint)(iVar9 < ptr_01[uVar10]);
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
      if (bVar2) {
        pbVar18 = pbVar18 + uVar3;
        iVar8 = -0x40000000;
        uVar10 = 0;
        do {
          iVar9 = iVar8 - gap;
          iVar8 = ptr_02[uVar10];
          if (ptr_02[uVar10] <= iVar9) {
            iVar8 = iVar9;
          }
          iVar16 = iVar8 - open;
          *pbVar18 = *pbVar18 | (ptr_00[uVar10] <= iVar9) * ' ' + 0x20U;
          if (iVar16 < ptr_02[uVar10 + 1]) {
            __s[uVar10] = ptr_02[uVar10 + 1];
            *pbVar18 = *pbVar18 | (ptr_03[uVar10] == 0) * '\x03' + 1U;
          }
          else {
            __s[uVar10] = iVar16;
            if (ptr_02[uVar10 + 1] == iVar16) {
              if (ptr_03[uVar10] == 0) {
                bVar6 = *pbVar18 | 4;
              }
              else {
                bVar6 = *pbVar18 | 2;
              }
              *pbVar18 = bVar6;
            }
            else {
              *pbVar18 = *pbVar18 | 2;
            }
          }
          if ((s1_end != 0) && (local_b0 < __s[uVar10])) {
            local_a4 = (int)uVar10;
            local_78 = (ulong)uVar3;
            local_b0 = __s[uVar10];
          }
          uVar10 = uVar10 + 1;
          pbVar18 = pbVar18 + size;
        } while (uVar13 != uVar10);
      }
    }
  }
  else {
    iVar8 = 0;
    if (s2_beg == 0) {
      iVar8 = -(gap * uVar3 + open);
    }
    *ptr_02 = iVar8;
  }
  if ((s2_end != 0) && (local_b0 < ptr_00[size_00])) {
    local_a4 = a + -1;
    local_78._0_4_ = uVar3;
    local_b0 = ptr_00[size_00];
  }
  if (s2_end == 0 && s1_end == 0) {
    local_a4 = a + -1;
    local_b0 = ptr_00[size_00];
    local_78._0_4_ = uVar3;
  }
  ppVar4->score = local_b0;
  ppVar4->end_query = local_a4;
  ppVar4->end_ref = (uint)local_78;
  parasail_free(ptr_03);
  parasail_free(ptr_02);
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(local_70);
    return ppVar4;
  }
  return ppVar4;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int8_t * restrict HT = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    Ex = parasail_memalign_int(16, s1Len);
    HT = (int8_t* restrict)result->trace->trace_table;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;
    if (!Ex) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            E[i] = MAX(E_ext, E_opn);
            HT[1LL*i*s2Len + j] = (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                  : PARASAIL_INS_E;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ht[i] = MAX(H_dag, E[i]);
            Ex[i] = (E[i] > H_dag);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                HT[1LL*i*s2Len + j] |= PARASAIL_DIAG_F;
            }
            else {
                HT[1LL*i*s2Len + j] |= PARASAIL_DEL_F;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HT[1LL*i*s2Len + j] |= Ex[i] ? PARASAIL_INS : PARASAIL_DIAG;
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                    }
                    else {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DIAG;
                    }
                }
                else {
                    HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                }
            }
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            E[i] = MAX(E_ext, E_opn);
            HT[1LL*i*s2Len + j] = (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                  : PARASAIL_INS_E;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ht[i] = MAX(H_dag, E[i]);
            Ex[i] = (E[i] > H_dag);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                HT[1LL*i*s2Len + j] |= PARASAIL_DIAG_F;
            }
            else {
                HT[1LL*i*s2Len + j] |= PARASAIL_DEL_F;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HT[1LL*i*s2Len + j] |= Ex[i] ? PARASAIL_INS : PARASAIL_DIAG;
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                    }
                    else {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DIAG;
                    }
                }
                else {
                    HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                }
            }
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(Ex);
    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}